

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorNinePatchInstancer::DecoratorNinePatchInstancer(DecoratorNinePatchInstancer *this)

{
  code *pcVar1;
  PropertyId PVar2;
  bool bVar3;
  PropertyDefinition *pPVar4;
  allocator<char> local_479;
  String local_478;
  allocator<char> local_451;
  String local_450;
  allocator<char> local_429;
  String local_428;
  allocator<char> local_401;
  String local_400;
  allocator<char> local_3d9;
  String local_3d8;
  allocator<char> local_3b1;
  String local_3b0;
  allocator<char> local_389;
  String local_388;
  allocator<char> local_361;
  String local_360;
  allocator<char> local_339;
  String local_338;
  allocator<char> local_311;
  String local_310;
  allocator<char> local_2e9;
  String local_2e8;
  allocator<char> local_2c1;
  String local_2c0;
  allocator<char> local_299;
  String local_298;
  allocator<char> local_271;
  String local_270;
  allocator<char> local_249;
  String local_248;
  allocator<char> local_221;
  String local_220;
  allocator<char> local_1f9;
  String local_1f8;
  allocator<char> local_1d1;
  String local_1d0;
  allocator<char> local_1a9;
  String local_1a8;
  allocator<char> local_181;
  String local_180;
  allocator<char> local_159;
  String local_158;
  allocator<char> local_131;
  String local_130;
  allocator<char> local_109;
  String local_108;
  allocator<char> local_e1;
  String local_e0;
  allocator<char> local_b9;
  String local_b8;
  allocator<char> local_91;
  String local_90;
  allocator<char> local_69;
  String local_68;
  allocator<char> local_31;
  String local_30;
  DecoratorNinePatchInstancer *local_10;
  DecoratorNinePatchInstancer *this_local;
  
  local_10 = this;
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorNinePatchInstancer_00815d50;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"outer",&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  pPVar4 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_30,
                      &local_68);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"string",&local_91);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_90,&local_b8);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->sprite_outer_id = PVar2;
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::allocator<char>::~allocator(&local_b9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator(&local_91);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::allocator<char>::~allocator(&local_69);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"inner",&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_109);
  pPVar4 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_e0,
                      &local_108);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"string",&local_131);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"",&local_159);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_130,&local_158);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->sprite_inner_id = PVar2;
  ::std::__cxx11::string::~string((string *)&local_158);
  ::std::allocator<char>::~allocator(&local_159);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::allocator<char>::~allocator(&local_131);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::allocator<char>::~allocator(&local_109);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator(&local_e1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"edge-top",&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"0px",&local_1a9);
  pPVar4 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_180,
                      &local_1a8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"number_length_percent",&local_1d1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_1d0,&local_1f8);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[0] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::allocator<char>::~allocator(&local_1f9);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::allocator<char>::~allocator(&local_1d1);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  ::std::allocator<char>::~allocator(&local_1a9);
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator(&local_181);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"edge-right",&local_221)
  ;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"0px",&local_249);
  pPVar4 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_220,
                      &local_248);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"number_length_percent",&local_271);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"",&local_299);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_270,&local_298);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[1] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_298);
  ::std::allocator<char>::~allocator(&local_299);
  ::std::__cxx11::string::~string((string *)&local_270);
  ::std::allocator<char>::~allocator(&local_271);
  ::std::__cxx11::string::~string((string *)&local_248);
  ::std::allocator<char>::~allocator(&local_249);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator(&local_221);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"edge-bottom",&local_2c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"0px",&local_2e9);
  pPVar4 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_2c0,
                      &local_2e8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"number_length_percent",&local_311);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"",&local_339);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_310,&local_338);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[2] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_338);
  ::std::allocator<char>::~allocator(&local_339);
  ::std::__cxx11::string::~string((string *)&local_310);
  ::std::allocator<char>::~allocator(&local_311);
  ::std::__cxx11::string::~string((string *)&local_2e8);
  ::std::allocator<char>::~allocator(&local_2e9);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator(&local_2c1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"edge-left",&local_361);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"0px",&local_389);
  pPVar4 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_360,
                      &local_388);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"number_length_percent",&local_3b1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"",&local_3d9);
  pPVar4 = PropertyDefinition::AddParser(pPVar4,&local_3b0,&local_3d8);
  PVar2 = PropertyDefinition::GetId(pPVar4);
  this->edge_ids[3] = PVar2;
  ::std::__cxx11::string::~string((string *)&local_3d8);
  ::std::allocator<char>::~allocator(&local_3d9);
  ::std::__cxx11::string::~string((string *)&local_3b0);
  ::std::allocator<char>::~allocator(&local_3b1);
  ::std::__cxx11::string::~string((string *)&local_388);
  ::std::allocator<char>::~allocator(&local_389);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::allocator<char>::~allocator(&local_361);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"edge",&local_401);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"edge-top, edge-right, edge-bottom, edge-left",&local_429);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_400,&local_428,Box);
  ::std::__cxx11::string::~string((string *)&local_428);
  ::std::allocator<char>::~allocator(&local_429);
  ::std::__cxx11::string::~string((string *)&local_400);
  ::std::allocator<char>::~allocator(&local_401);
  if (((this->sprite_outer_id == Invalid) || (this->sprite_inner_id == Invalid)) &&
     (bVar3 = Assert("RMLUI_ASSERT(sprite_outer_id != PropertyId::Invalid && sprite_inner_id != PropertyId::Invalid)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorNinePatch.cpp"
                     ,0xc3), !bVar3)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"decorator",&local_451);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"outer, inner, edge?",&local_479);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_450,&local_478,
             RecursiveCommaSeparated);
  ::std::__cxx11::string::~string((string *)&local_478);
  ::std::allocator<char>::~allocator(&local_479);
  ::std::__cxx11::string::~string((string *)&local_450);
  ::std::allocator<char>::~allocator(&local_451);
  return;
}

Assistant:

DecoratorNinePatchInstancer::DecoratorNinePatchInstancer()
{
	sprite_outer_id = RegisterProperty("outer", "").AddParser("string").GetId();
	sprite_inner_id = RegisterProperty("inner", "").AddParser("string").GetId();
	edge_ids[0] = RegisterProperty("edge-top", "0px").AddParser("number_length_percent").GetId();
	edge_ids[1] = RegisterProperty("edge-right", "0px").AddParser("number_length_percent").GetId();
	edge_ids[2] = RegisterProperty("edge-bottom", "0px").AddParser("number_length_percent").GetId();
	edge_ids[3] = RegisterProperty("edge-left", "0px").AddParser("number_length_percent").GetId();

	RegisterShorthand("edge", "edge-top, edge-right, edge-bottom, edge-left", ShorthandType::Box);

	RMLUI_ASSERT(sprite_outer_id != PropertyId::Invalid && sprite_inner_id != PropertyId::Invalid);

	RegisterShorthand("decorator", "outer, inner, edge?", ShorthandType::RecursiveCommaSeparated);
}